

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O0

void __thiscall cmExtraCodeLiteGenerator::Generate(cmExtraCodeLiteGenerator *this)

{
  cmGlobalGenerator *this_00;
  bool bVar1;
  __type _Var2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *this_01;
  const_reference ppcVar3;
  string *psVar4;
  string *__rhs;
  allocator<char> local_581;
  string local_580;
  reference local_560;
  string *it_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string local_538;
  allocator<char> local_511;
  string local_510;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d8;
  undefined1 local_4c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ProjectNames;
  string local_4a0;
  byte local_47a;
  allocator<char> local_479;
  undefined1 local_478 [6];
  bool targetsAreProjects;
  undefined1 local_458 [8];
  cmXMLWriter xml;
  cmGeneratedFileStream fout;
  cmAlphaNum local_168;
  string local_138;
  string local_118;
  string local_f8;
  cmMakefile *local_d8;
  cmMakefile *mf;
  cmLocalGenerator *lg;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  *it;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *projectMap;
  string workspaceSourcePath;
  string workspaceFileName;
  string workspaceOutputDir;
  string workspaceProjectName;
  cmExtraCodeLiteGenerator *this_local;
  
  std::__cxx11::string::string((string *)(workspaceOutputDir.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(workspaceFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(workspaceSourcePath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&projectMap);
  this_01 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
           ::begin(this_01);
  it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
          ::end(this_01);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&it);
    if (!bVar1) {
LAB_0050a35a:
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)&xml.ElementOpen,
                 (string *)((long)&workspaceSourcePath.field_2 + 8),false,None);
      cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_458,(ostream *)&xml.ElementOpen,0);
      cmXMLWriter::StartDocument((cmXMLWriter *)local_458,"utf-8");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_478,"CodeLite_Workspace",&local_479);
      cmXMLWriter::StartElement((cmXMLWriter *)local_458,(string *)local_478);
      std::__cxx11::string::~string((string *)local_478);
      std::allocator<char>::~allocator(&local_479);
      cmXMLWriter::Attribute<std::__cxx11::string>
                ((cmXMLWriter *)local_458,"Name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&workspaceOutputDir.field_2 + 8));
      this_00 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a0,"CMAKE_CODELITE_USE_TARGETS",
                 (allocator<char> *)
                 ((long)&ProjectNames.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      bVar1 = cmGlobalGenerator::GlobalSettingIsOn(this_00,&local_4a0);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&ProjectNames.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_47a = bVar1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_4c0);
      if ((local_47a & 1) == 0) {
        CreateProjectsByProjectMaps_abi_cxx11_(&local_4f0,this,(cmXMLWriter *)local_458);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_4c0,&local_4f0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4f0);
      }
      else {
        CreateProjectsByTarget_abi_cxx11_(&local_4d8,this,(cmXMLWriter *)local_458);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_4c0,&local_4d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4d8);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"BuildMatrix",&local_511);
      cmXMLWriter::StartElement((cmXMLWriter *)local_458,&local_510);
      std::__cxx11::string::~string((string *)&local_510);
      std::allocator<char>::~allocator(&local_511);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_538,"WorkspaceConfiguration",
                 (allocator<char> *)((long)&__range1_1 + 7));
      cmXMLWriter::StartElement((cmXMLWriter *)local_458,&local_538);
      std::__cxx11::string::~string((string *)&local_538);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
      cmXMLWriter::Attribute<std::__cxx11::string>
                ((cmXMLWriter *)local_458,"Name",&this->ConfigName);
      cmXMLWriter::Attribute<char[4]>((cmXMLWriter *)local_458,"Selected",(char (*) [4])"yes");
      __end1_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_4c0);
      it_1 = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_4c0);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&it_1), bVar1) {
        local_560 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end1_1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_580,"Project",&local_581);
        cmXMLWriter::StartElement((cmXMLWriter *)local_458,&local_580);
        std::__cxx11::string::~string((string *)&local_580);
        std::allocator<char>::~allocator(&local_581);
        cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_458,"Name",local_560);
        cmXMLWriter::Attribute<std::__cxx11::string>
                  ((cmXMLWriter *)local_458,"ConfigName",&this->ConfigName);
        cmXMLWriter::EndElement((cmXMLWriter *)local_458);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1_1);
      }
      cmXMLWriter::EndElement((cmXMLWriter *)local_458);
      cmXMLWriter::EndElement((cmXMLWriter *)local_458);
      cmXMLWriter::EndElement((cmXMLWriter *)local_458);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_4c0);
      cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_458);
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&xml.ElementOpen);
      std::__cxx11::string::~string((string *)&projectMap);
      std::__cxx11::string::~string((string *)(workspaceSourcePath.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(workspaceFileName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(workspaceOutputDir.field_2._M_local_buf + 8));
      return;
    }
    lg = (cmLocalGenerator *)
         std::
         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
         ::operator*(&__end1);
    ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                         &(lg->super_cmOutputConverter).LinkScriptShell,0);
    mf = (cmMakefile *)*ppcVar3;
    local_d8 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)mf);
    GetConfigurationName_abi_cxx11_(&local_f8,this,local_d8);
    std::__cxx11::string::operator=((string *)&this->ConfigName,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)mf);
    __rhs = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)mf);
    _Var2 = std::operator==(psVar4,__rhs);
    if (_Var2) {
      psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)mf);
      std::__cxx11::string::operator=
                ((string *)(workspaceFileName.field_2._M_local_buf + 8),(string *)psVar4);
      cmLocalGenerator::GetProjectName_abi_cxx11_(&local_118,(cmLocalGenerator *)mf);
      std::__cxx11::string::operator=
                ((string *)(workspaceOutputDir.field_2._M_local_buf + 8),(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      psVar4 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)mf);
      std::__cxx11::string::operator=((string *)&projectMap,(string *)psVar4);
      cmAlphaNum::cmAlphaNum(&local_168,(string *)((long)&workspaceFileName.field_2 + 8));
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&fout.field_0x260,'/');
      cmStrCat<std::__cxx11::string,char[11]>
                (&local_138,&local_168,(cmAlphaNum *)&fout.field_0x260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&workspaceOutputDir.field_2 + 8),(char (*) [11])".workspace");
      std::__cxx11::string::operator=
                ((string *)(workspaceSourcePath.field_2._M_local_buf + 8),(string *)&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)mf);
      std::__cxx11::string::operator=((string *)&this->WorkspacePath,(string *)psVar4);
      goto LAB_0050a35a;
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmExtraCodeLiteGenerator::Generate()
{
  // Hold root tree information for creating the workspace
  std::string workspaceProjectName;
  std::string workspaceOutputDir;
  std::string workspaceFileName;
  std::string workspaceSourcePath;

  const std::map<std::string, std::vector<cmLocalGenerator*>>& projectMap =
    this->GlobalGenerator->GetProjectMap();

  // loop projects and locate the root project.
  // and extract the information for creating the worspace
  // root makefile
  for (auto const& it : projectMap) {
    cmLocalGenerator* lg = it.second[0];
    const cmMakefile* mf = lg->GetMakefile();
    this->ConfigName = this->GetConfigurationName(mf);

    if (lg->GetCurrentBinaryDirectory() == lg->GetBinaryDirectory()) {
      workspaceOutputDir = lg->GetCurrentBinaryDirectory();
      workspaceProjectName = lg->GetProjectName();
      workspaceSourcePath = lg->GetSourceDirectory();
      workspaceFileName =
        cmStrCat(workspaceOutputDir, '/', workspaceProjectName, ".workspace");
      this->WorkspacePath = lg->GetCurrentBinaryDirectory();
      break;
    }
  }

  cmGeneratedFileStream fout(workspaceFileName);
  cmXMLWriter xml(fout);

  xml.StartDocument("utf-8");
  xml.StartElement("CodeLite_Workspace");
  xml.Attribute("Name", workspaceProjectName);

  bool const targetsAreProjects =
    this->GlobalGenerator->GlobalSettingIsOn("CMAKE_CODELITE_USE_TARGETS");

  std::vector<std::string> ProjectNames;
  if (targetsAreProjects) {
    ProjectNames = this->CreateProjectsByTarget(&xml);
  } else {
    ProjectNames = this->CreateProjectsByProjectMaps(&xml);
  }

  xml.StartElement("BuildMatrix");
  xml.StartElement("WorkspaceConfiguration");
  xml.Attribute("Name", this->ConfigName);
  xml.Attribute("Selected", "yes");

  for (std::string const& it : ProjectNames) {
    xml.StartElement("Project");
    xml.Attribute("Name", it);
    xml.Attribute("ConfigName", this->ConfigName);
    xml.EndElement();
  }

  xml.EndElement(); // WorkspaceConfiguration
  xml.EndElement(); // BuildMatrix
  xml.EndElement(); // CodeLite_Workspace
}